

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combinator.hpp
# Opt level: O2

result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t> *
__thiscall
toml::detail::character<(char)34>::invoke<std::vector<char,std::allocator<char>>>
          (result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
           *__return_storage_ptr__,character<(char)34> *this,
          location<std::vector<char,_std::allocator<char>_>_> *loc)

{
  const_iterator f;
  region<std::vector<char,_std::allocator<char>_>_> local_b0;
  region<std::vector<char,_std::allocator<char>_>_> local_68;
  
  f._M_current = *(char **)(this + 0x40);
  if ((f._M_current == *(char **)(*(long *)(this + 8) + 8)) || (*f._M_current != '\"')) {
    __return_storage_ptr__->is_ok_ = false;
  }
  else {
    location<std::vector<char,_std::allocator<char>_>_>::advance
              ((location<std::vector<char,_std::allocator<char>_>_> *)this,1);
    region<std::vector<char,_std::allocator<char>_>_>::region
              (&local_b0,(location<std::vector<char,_std::allocator<char>_>_> *)this,f,
               (const_iterator)*(char **)(this + 0x40));
    region<std::vector<char,_std::allocator<char>_>_>::region(&local_68,&local_b0);
    result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>::
    result(__return_storage_ptr__,(success_type *)&local_68);
    region<std::vector<char,_std::allocator<char>_>_>::~region(&local_68);
    region<std::vector<char,_std::allocator<char>_>_>::~region(&local_b0);
  }
  return __return_storage_ptr__;
}

Assistant:

static result<region<Cont>, none_t>
    invoke(location<Cont>& loc)
    {
        static_assert(std::is_same<char, typename Cont::value_type>::value,
                      "internal error: container::value_type should be `char`.");

        if(loc.iter() == loc.end()) {return none();}
        const auto first = loc.iter();

        const char c = *(loc.iter());
        if(c != target)
        {
            return none();
        }
        loc.advance(); // update location

        return ok(region<Cont>(loc, first, loc.iter()));
    }